

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::CoronaLoader::loadGroupNode(CoronaLoader *this,Ref<embree::XML> *xml)

{
  ulong uVar1;
  size_type sVar2;
  runtime_error *this_00;
  Ref<embree::XML> *child;
  _func_int **pp_Var3;
  long *plVar4;
  _Base_ptr in_RDX;
  Node *in_RDI;
  size_t i_1;
  Ref<embree::SceneGraph::GroupNode> instances;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> objects;
  avector<AffineSpace3fa> *xfms;
  Ref<embree::SceneGraph::MaterialNode> material;
  pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
  p;
  Ref<embree::SceneGraph::Node> *in_stack_fffffffffffffc90;
  GroupNode *in_stack_fffffffffffffc98;
  size_t in_stack_fffffffffffffca8;
  GroupNode *in_stack_fffffffffffffcb0;
  ParseLocation *in_stack_fffffffffffffd38;
  AffineSpace3fa *xfm;
  TransformNode *in_stack_fffffffffffffd98;
  ulong local_228;
  long *local_218;
  long *local_210;
  ulong local_208;
  Ref<embree::XML> *pRVar5;
  Ref<embree::XML> *pRVar6;
  CoronaLoader *this_01;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [112];
  _Base_ptr local_170;
  _Base_ptr local_158;
  _Base_ptr local_150;
  _Base_ptr local_148;
  _Base_ptr local_140;
  Ref<embree::SceneGraph::Node> local_130;
  AffineSpace3fa *local_128;
  undefined1 *local_120;
  long **local_118;
  long **local_110;
  Ref<embree::XML> *in_stack_ffffffffffffff00;
  CoronaLoader *in_stack_ffffffffffffff08;
  
  local_170 = in_RDX;
  sVar2 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::size
                    ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *
                     )(*(long *)in_RDX + 0x80));
  if (sVar2 == 0) {
    local_1e0[0x23] = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_140 = local_170;
    ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffd38);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90);
    std::runtime_error::runtime_error(this_00,(string *)(local_1e0 + 0x50));
    local_1e0[0x23] = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_148 = local_170;
  std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
            ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
             (*(long *)local_170 + 0x80),0);
  loadInstances(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  local_130.ptr = (Node *)(local_1f0 + 8);
  xfm = (AffineSpace3fa *)local_1f0;
  local_1f0._0_8_ = local_1f0._8_8_;
  local_128 = xfm;
  if ((long *)local_1f0._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_1f0._8_8_ + 0x10))();
  }
  this_01 = (CoronaLoader *)local_1e0;
  child = (Ref<embree::XML> *)::operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  pRVar5 = child;
  if (child != (Ref<embree::XML> *)0x0) {
    (**(code **)&child->ptr->loc)();
  }
  local_208 = 1;
  while( true ) {
    uVar1 = local_208;
    local_150 = local_170;
    sVar2 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::size
                      ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                        *)(*(long *)local_170 + 0x80));
    if (sVar2 <= uVar1) break;
    local_158 = local_170;
    std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
              ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
               (*(long *)local_170 + 0x80),local_208);
    loadObject(this_01,pRVar5);
    SceneGraph::GroupNode::add(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    if (local_210 != (long *)0x0) {
      (**(code **)(*local_210 + 0x18))();
    }
    local_208 = local_208 + 1;
  }
  local_118 = &local_218;
  local_120 = local_1f0;
  local_218 = (long *)local_1f0._0_8_;
  pRVar6 = pRVar5;
  if ((long *)local_1f0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_1f0._0_8_ + 0x10))();
  }
  (**(code **)((long)&((string *)&pRVar5->ptr->loc)->field_2 + 8))(pRVar5,&local_218);
  local_110 = &local_218;
  if (local_218 != (long *)0x0) {
    (**(code **)(*local_218 + 0x18))();
  }
  pp_Var3 = (_func_int **)::operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  if (pp_Var3 != (_func_int **)0x0) {
    (**(code **)(*pp_Var3 + 0x10))();
  }
  local_228 = 0;
  while( true ) {
    if ((this_01->path).filename._M_string_length <= local_228) break;
    plVar4 = (long *)SceneGraph::TransformNode::operator_new(0x4136b5);
    pRVar5 = pRVar6;
    if (pRVar6 != (Ref<embree::XML> *)0x0) {
      (**(code **)&pRVar6->ptr->loc)();
    }
    SceneGraph::TransformNode::TransformNode
              (in_stack_fffffffffffffd98,xfm,(Ref<embree::SceneGraph::Node> *)child);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x10))();
    }
    SceneGraph::GroupNode::add(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x18))();
    }
    if (pRVar6 != (Ref<embree::XML> *)0x0) {
      (*(code *)((string *)&pRVar6->ptr->loc)->_M_string_length)();
    }
    local_228 = local_228 + 1;
    pRVar6 = pRVar5;
  }
  (in_RDI->super_RefCount)._vptr_RefCount = pp_Var3;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  if (pp_Var3 != (_func_int **)0x0) {
    (**(code **)(*pp_Var3 + 0x18))();
  }
  if (pRVar6 != (Ref<embree::XML> *)0x0) {
    (*(code *)((string *)&pRVar6->ptr->loc)->_M_string_length)();
  }
  if ((long *)local_1f0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_1f0._0_8_ + 0x18))();
  }
  std::
  pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
  ::~pair((pair<embree::Ref<embree::SceneGraph::MaterialNode>,_embree::vector_t<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_embree::aligned_allocator<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>_>,_16UL>_>_>
           *)in_stack_fffffffffffffc98);
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> CoronaLoader::loadGroupNode(const Ref<XML>& xml) 
  {
    if (xml->children.size() < 1) 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid group node");

    /* load instances */
    auto p = loadInstances(xml->children[0]);
    Ref<SceneGraph::MaterialNode> material = p.first;
    avector<AffineSpace3fa>& xfms = p.second;
    
    /* load meshes */
    Ref<SceneGraph::GroupNode> objects = new SceneGraph::GroupNode;
    for (size_t i=1; i<xml->children.size(); i++)
      objects->add(loadObject(xml->children[i]));
    
    /* force material */
    objects->setMaterial(material);

    /* create instances */
    Ref<SceneGraph::GroupNode> instances = new SceneGraph::GroupNode;
    for (size_t i=0; i<xfms.size(); i++) 
      instances->add(new SceneGraph::TransformNode(xfms[i],objects.cast<SceneGraph::Node>()));

    return instances.cast<SceneGraph::Node>();
  }